

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_10(QPDF *pdf,char *arg2)

{
  reference pvVar1;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle QVar3;
  allocator<char> local_69;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [3];
  QPDF local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  QPDF local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
  pvVar1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at(&pages,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"BT /F1 12 Tf 72 620 Td (Baked) Tj ET\n",&local_69);
  QPDFObjectHandle::newStream(local_38,(string *)pdf);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pvVar1;
  QPDFPageObjectHelper::addPageContents(QVar2,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"BT /F1 18 Tf 72 520 Td (Mashed) Tj ET\n",&local_69);
  QPDFObjectHandle::newStream(local_48,(string *)pdf);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pvVar1;
  QPDFPageObjectHelper::addPageContents(QVar3,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::~string((string *)&w);
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&w);
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_60);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&pages);
  return;
}

Assistant:

static void
test_10(QPDF& pdf, char const* arg2)
{
    std::vector<QPDFPageObjectHelper> pages = QPDFPageDocumentHelper(pdf).getAllPages();
    QPDFPageObjectHelper& ph(pages.at(0));
    ph.addPageContents(
        QPDFObjectHandle::newStream(&pdf, "BT /F1 12 Tf 72 620 Td (Baked) Tj ET\n"), true);
    ph.addPageContents(
        QPDFObjectHandle::newStream(&pdf, "BT /F1 18 Tf 72 520 Td (Mashed) Tj ET\n"), false);

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}